

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O0

bool __thiscall basisu::basis_compressor::read_source_images(basis_compressor *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  uint32_t uVar8;
  uint uVar9;
  long lVar10;
  color_rgba *pcVar11;
  byte *pbVar12;
  vector<basisu::image> *pvVar13;
  uint *puVar14;
  char *pcVar15;
  image_stats *piVar16;
  undefined8 uVar17;
  basisu_backend_slice_desc *pbVar18;
  basisu_backend_slice_desc *pbVar19;
  bool_param *in_RDI;
  float fVar20;
  undefined1 auVar21 [16];
  basisu_backend_slice_desc *prev_slice_desc_1;
  basisu_backend_slice_desc *slice_desc_2;
  uint32_t i_3;
  int level_delta;
  int image_delta;
  basisu_backend_slice_desc *slice_desc_1;
  basisu_backend_slice_desc *prev_slice_desc;
  uint32_t i_2;
  basisu_backend_slice_desc *slice_desc;
  uint32_t dest_image_index;
  bool is_alpha_slice;
  uint32_t orig_height;
  uint32_t orig_width;
  image *slice_image;
  uint32_t slice_index;
  uint8_t a;
  uint32_t x_3;
  uint32_t y_3;
  image lvl_a;
  image lvl_rgb;
  uint32_t i_1;
  uint_vec new_mip_indices;
  vector<basisu::image> alpha_slices;
  uint32_t i;
  uint_vec mip_indices;
  color_rgba *c_1;
  uint32_t x_2;
  uint32_t y_2;
  image *mip_img_1;
  uint32_t mip_index_1;
  image *file_image_1;
  vector<basisu::image> slices;
  string *source_filename;
  uint32_t source_file_index_2;
  image *mip_img;
  uint32_t mip_index;
  uint32_t source_file_index_1;
  image temp_img_1;
  int new_height_1;
  int new_width_1;
  image temp_img;
  int new_height;
  int new_width;
  bool has_alpha;
  color_rgba *c;
  uint32_t x_1;
  uint32_t y_1;
  bool alpha_swizzled;
  uint32_t x;
  uint32_t y;
  image alpha_data;
  char *pSource_alpha_image;
  image file_image;
  char *pSource_filename;
  uint32_t source_file_index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  source_filenames;
  vector<basisu::image> source_images;
  uint32_t total_macroblocks;
  uint32_t total_source_files;
  uint32_t in_stack_00001f6c;
  undefined1 in_stack_00001f73;
  float in_stack_00001f74;
  char *in_stack_00001f78;
  undefined1 in_stack_00001f87;
  image *in_stack_00001f88;
  image *in_stack_00001f90;
  uint32_t in_stack_00001fb0;
  uint32_t in_stack_fffffffffffff928;
  uint32_t in_stack_fffffffffffff92c;
  uint32_t in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff934;
  uint32_t in_stack_fffffffffffff938;
  uint32_t in_stack_fffffffffffff93c;
  undefined4 in_stack_fffffffffffff940;
  uint32_t in_stack_fffffffffffff944;
  uint32_t in_stack_fffffffffffff948;
  uint32_t in_stack_fffffffffffff94c;
  image *in_stack_fffffffffffff950;
  size_t in_stack_fffffffffffff958;
  undefined7 in_stack_fffffffffffff960;
  undefined1 in_stack_fffffffffffff967;
  char *in_stack_fffffffffffff968;
  undefined7 in_stack_fffffffffffff970;
  undefined1 in_stack_fffffffffffff977;
  undefined8 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff980;
  uint uVar22;
  undefined4 in_stack_fffffffffffff984;
  uint32_t in_stack_fffffffffffff98c;
  undefined8 in_stack_fffffffffffff990;
  image *in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff9a4;
  undefined4 in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9ac;
  image *in_stack_fffffffffffff9b0;
  basis_compressor *in_stack_fffffffffffff9b8;
  uint32_t local_2c4;
  uint local_2a4;
  uint local_284;
  string local_270 [39];
  bool local_249;
  uint32_t local_248;
  uint32_t local_244;
  image *local_240;
  uint local_238;
  byte local_231;
  uint local_230;
  uint local_22c;
  image local_228 [2];
  uint local_1e4;
  vector<unsigned_int> local_1e0;
  vector<basisu::image> local_1d0;
  uint local_1bc;
  vector<unsigned_int> local_1b8;
  color_rgba *local_1a8;
  uint local_1a0;
  uint local_19c;
  image *local_198;
  uint local_18c;
  image *local_188;
  vector<basisu::image> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  uint local_164;
  image *local_160;
  uint local_154;
  uint local_150;
  allocator<char> local_149;
  string local_148 [64];
  uint local_108;
  uint local_104;
  uint local_dc;
  uint local_d8;
  byte local_d1;
  color_rgba *local_d0;
  uint local_c4;
  uint local_c0;
  bool local_b9;
  uint local_b8;
  uint local_b4;
  image local_b0;
  char *local_90;
  int local_84;
  image local_80;
  char *local_60;
  uint local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_48;
  vector<basisu::image> local_38;
  uint local_28;
  uint32_t local_24;
  byte local_11;
  
  debug_printf("basis_compressor::read_source_images\n");
  bVar4 = bool_param::operator_cast_to_bool(in_RDI + 0xb8);
  if (bVar4) {
    local_2c4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(in_RDI + 8));
  }
  else {
    local_2c4 = vector<basisu::image>::size((vector<basisu::image> *)(in_RDI + 0x28));
  }
  local_24 = local_2c4;
  if (local_2c4 == 0) {
    local_11 = 0;
    goto LAB_004baa2f;
  }
  vector<basisu::image_stats>::resize
            ((vector<basisu::image_stats> *)
             CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
             CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
             SUB41((uint)in_stack_fffffffffffff934 >> 0x18,0));
  vector<basisu::basisu_backend_slice_desc>::resize
            ((vector<basisu::basisu_backend_slice_desc> *)
             CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
             CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
             SUB41((uint)in_stack_fffffffffffff934 >> 0x18,0));
  vector<basisu::image>::resize
            ((vector<basisu::image> *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
             CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
             SUB41((uint)in_stack_fffffffffffff934 >> 0x18,0));
  *(undefined4 *)(in_RDI + 0x290) = 0;
  local_28 = 0;
  in_RDI[0x748] = (bool_param)0x0;
  vector<basisu::image>::vector(&local_38);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::vector
            (&local_48);
  for (local_58 = 0; local_58 < local_24; local_58 = local_58 + 1) {
    local_60 = "";
    image::image((image *)0x4b8048);
    bVar4 = bool_param::operator_cast_to_bool(in_RDI + 0xb8);
    if (bVar4) {
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                 CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
      local_60 = (char *)std::__cxx11::string::c_str();
      bVar4 = load_image(local_60,&local_80);
      if (bVar4) {
        bVar4 = bool_param::operator_cast_to_bool(in_RDI + 0x6a);
        pcVar15 = local_60;
        if (bVar4) {
          uVar5 = image::get_width(&local_80);
          uVar6 = image::get_height(&local_80);
          printf("Read source image \"%s\", %ux%u\n",pcVar15,(ulong)uVar5,(ulong)uVar6);
        }
        uVar22 = local_58;
        uVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(in_RDI + 0x18));
        if (uVar22 < uVar5) {
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          lVar10 = std::__cxx11::string::size();
          if (lVar10 != 0) {
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                         CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
            local_90 = (char *)std::__cxx11::string::c_str();
            image::image((image *)0x4b82a0);
            bVar4 = load_image(local_90,&local_b0);
            pcVar15 = local_90;
            if (bVar4) {
              uVar5 = image::get_width(&local_b0);
              uVar6 = image::get_height(&local_b0);
              printf("Read source alpha image \"%s\", %ux%u\n",pcVar15,(ulong)uVar5,(ulong)uVar6);
              image::get_width(&local_80);
              image::get_height(&local_80);
              image::crop(in_stack_fffffffffffff998,
                          (uint32_t)((ulong)in_stack_fffffffffffff990 >> 0x20),
                          (uint32_t)in_stack_fffffffffffff990,in_stack_fffffffffffff98c,
                          (color_rgba *)
                          CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                          SUB81((ulong)in_stack_fffffffffffff978 >> 0x38,0));
              for (local_b4 = 0; uVar22 = local_b4, uVar5 = image::get_height(&local_80),
                  uVar22 < uVar5; local_b4 = local_b4 + 1) {
                for (local_b8 = 0; uVar22 = local_b8, uVar5 = image::get_width(&local_80),
                    uVar22 < uVar5; local_b8 = local_b8 + 1) {
                  pcVar11 = image::operator()((image *)CONCAT44(in_stack_fffffffffffff944,
                                                                in_stack_fffffffffffff940),
                                              in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
                  iVar7 = color_rgba::get_709_luma(pcVar11);
                  pcVar11 = image::operator()((image *)CONCAT44(in_stack_fffffffffffff944,
                                                                in_stack_fffffffffffff940),
                                              in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
                  (pcVar11->field_0).m_comps[3] = (uint8_t)iVar7;
                }
              }
              local_84 = 0;
            }
            else {
              error_printf("Failed reading source image: %s\n",local_90);
              local_11 = 0;
              local_84 = 1;
            }
            image::~image((image *)0x4b8530);
            if (local_84 != 0) goto LAB_004b8fac;
          }
        }
        goto LAB_004b8582;
      }
      error_printf("Failed reading source image: %s\n",local_60);
      local_11 = 0;
      local_84 = 1;
    }
    else {
      vector<basisu::image>::operator[]
                ((vector<basisu::image> *)
                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                 CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
      image::operator=((image *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       (image *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
LAB_004b8582:
      bVar4 = bool_param::operator_cast_to_bool(in_RDI + 200);
      if (bVar4) {
        image::renormalize_normal_map
                  ((image *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
      }
      local_b9 = false;
      if ((((in_RDI[0xc4] != (bool_param)0x0) || (in_RDI[0xc5] != (bool_param)0x1)) ||
          (in_RDI[0xc6] != (bool_param)0x2)) || (in_RDI[199] != (bool_param)0x3)) {
        for (local_c0 = 0; uVar22 = local_c0, uVar5 = image::get_height(&local_80), uVar22 < uVar5;
            local_c0 = local_c0 + 1) {
          for (local_c4 = 0; uVar22 = local_c4, uVar5 = image::get_width(&local_80), uVar22 < uVar5;
              local_c4 = local_c4 + 1) {
            local_d0 = image::operator()((image *)CONCAT44(in_stack_fffffffffffff944,
                                                           in_stack_fffffffffffff940),
                                         in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
            pcVar11 = image::operator()((image *)CONCAT44(in_stack_fffffffffffff944,
                                                          in_stack_fffffffffffff940),
                                        in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
            pbVar12 = color_rgba::operator[]
                                ((color_rgba *)
                                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                                 in_stack_fffffffffffff92c);
            bVar1 = *pbVar12;
            pbVar12 = color_rgba::operator[]
                                ((color_rgba *)
                                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                                 in_stack_fffffffffffff92c);
            bVar2 = *pbVar12;
            pbVar12 = color_rgba::operator[]
                                ((color_rgba *)
                                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                                 in_stack_fffffffffffff92c);
            bVar3 = *pbVar12;
            pbVar12 = color_rgba::operator[]
                                ((color_rgba *)
                                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                                 in_stack_fffffffffffff92c);
            color_rgba::set_noclamp_rgba(pcVar11,(uint)bVar1,(uint)bVar2,(uint)bVar3,(uint)*pbVar12)
            ;
          }
        }
        local_b9 = in_RDI[199] != (bool_param)0x3;
      }
      local_d1 = 0;
      bVar4 = bool_param::operator_cast_to_bool(in_RDI + 0xc0);
      if ((bVar4) || ((local_b9 & 1U) != 0)) {
        local_d1 = 1;
      }
      else {
        bVar4 = bool_param::operator_cast_to_bool(in_RDI + 0xbe);
        if (bVar4) {
          bVar4 = image::has_alpha((image *)CONCAT44(in_stack_fffffffffffff93c,
                                                     in_stack_fffffffffffff938));
          if (bVar4) {
            local_d1 = 1;
          }
        }
        else {
          image::set_alpha((image *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                           (uint8_t)(in_stack_fffffffffffff93c >> 0x18));
        }
      }
      uVar22 = local_58;
      pcVar15 = local_60;
      if ((local_d1 & 1) != 0) {
        in_RDI[0x748] = (bool_param)0x1;
      }
      uVar5 = image::get_width(&local_80);
      uVar6 = image::get_height(&local_80);
      debug_printf("Source image index %u filename %s %ux%u has alpha: %u\n",(ulong)uVar22,pcVar15,
                   (ulong)uVar5,(ulong)uVar6,(ulong)(local_d1 & 1));
      bVar4 = bool_param::operator_cast_to_bool(in_RDI + 0x68);
      if (bVar4) {
        image::flip_y((image *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
      }
      iVar7 = param::operator_cast_to_int((param *)(in_RDI + 0x1c8));
      if ((iVar7 < 1) || (iVar7 = param::operator_cast_to_int((param *)(in_RDI + 0x1dc)), iVar7 < 1)
         ) {
        fVar20 = param::operator_cast_to_float((param *)(in_RDI + 0x1f0));
        if (0.0 < fVar20) {
          uVar5 = image::get_width(&local_80);
          fVar20 = param::operator_cast_to_float((param *)(in_RDI + 0x1f0));
          auVar21 = roundss(ZEXT416((uint)((float)uVar5 * fVar20)),
                            ZEXT416((uint)((float)uVar5 * fVar20)),10);
          iVar7 = maximum<int>(1,(int)auVar21._0_4_);
          local_104 = minimum<int>(iVar7,0x4000);
          uVar5 = image::get_height(&local_80);
          fVar20 = param::operator_cast_to_float((param *)(in_RDI + 0x1f0));
          auVar21 = roundss(ZEXT416((uint)((float)uVar5 * fVar20)),
                            ZEXT416((uint)((float)uVar5 * fVar20)),10);
          iVar7 = maximum<int>(1,(int)auVar21._0_4_);
          local_108 = minimum<int>(iVar7,0x4000);
          debug_printf("Resampling to %ix%i\n",(ulong)local_104,(ulong)local_108);
          image::image(in_stack_fffffffffffff950,in_stack_fffffffffffff94c,in_stack_fffffffffffff948
                       ,in_stack_fffffffffffff944);
          bool_param::operator_cast_to_bool(in_RDI + 0x88);
          in_stack_fffffffffffff928 = 4;
          image_resample(in_stack_00001f90,in_stack_00001f88,(bool)in_stack_00001f87,
                         in_stack_00001f78,in_stack_00001f74,(bool)in_stack_00001f73,
                         in_stack_00001f6c,in_stack_00001fb0);
          image::swap((image *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                      (image *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          image::~image((image *)0x4b8deb);
        }
      }
      else {
        iVar7 = param::operator_cast_to_int((param *)(in_RDI + 0x1c8));
        local_d8 = minimum<int>(iVar7,0x4000);
        iVar7 = param::operator_cast_to_int((param *)(in_RDI + 0x1dc));
        local_dc = minimum<int>(iVar7,0x4000);
        debug_printf("Resampling to %ix%i\n",(ulong)local_d8,(ulong)local_dc);
        image::image(in_stack_fffffffffffff950,in_stack_fffffffffffff94c,in_stack_fffffffffffff948,
                     in_stack_fffffffffffff944);
        bool_param::operator_cast_to_bool(in_RDI + 0x88);
        in_stack_fffffffffffff928 = 4;
        image_resample(in_stack_00001f90,in_stack_00001f88,(bool)in_stack_00001f87,in_stack_00001f78
                       ,in_stack_00001f74,(bool)in_stack_00001f73,in_stack_00001f6c,
                       in_stack_00001fb0);
        image::swap((image *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                    (image *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        image::~image((image *)0x4b8b7b);
      }
      uVar5 = image::get_width(&local_80);
      if ((uVar5 == 0) || (uVar5 = image::get_height(&local_80), uVar5 == 0)) {
        error_printf(
                    "basis_compressor::read_source_images: Source image has a zero width and/or height!\n"
                    );
        local_11 = 0;
        local_84 = 1;
      }
      else {
        uVar5 = image::get_width(&local_80);
        if ((uVar5 < 0x4001) && (uVar5 = image::get_height(&local_80), uVar5 < 0x4001)) {
          vector<basisu::image>::enlarge
                    ((vector<basisu::image> *)
                     CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     in_stack_fffffffffffff92c);
          image::swap((image *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                      (image *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
                     in_stack_fffffffffffff968,
                     (allocator<char> *)
                     CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
          std::__cxx11::string::~string(local_148);
          std::allocator<char>::~allocator(&local_149);
          local_84 = 0;
        }
        else {
          error_printf("basis_compressor::read_source_images: Source image \"%s\" is too large!\n",
                       local_60);
          local_11 = 0;
          local_84 = 1;
        }
      }
    }
LAB_004b8fac:
    image::~image((image *)0x4b8fb9);
    if (local_84 != 0) goto LAB_004ba9f7;
  }
  uVar5 = vector<basisu::vector<basisu::image>_>::size
                    ((vector<basisu::vector<basisu::image>_> *)(in_RDI + 0x38));
  if (uVar5 == 0) {
LAB_004b9276:
    debug_printf("Any source image has alpha: %u\n",(ulong)((byte)in_RDI[0x748] & 1));
    for (local_164 = 0; local_164 < local_24; local_164 = local_164 + 1) {
      local_170 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
      vector<basisu::image>::vector(&local_180);
      vector<basisu::image>::reserve
                ((vector<basisu::image> *)
                 CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                 in_stack_fffffffffffff958);
      local_188 = vector<basisu::image>::operator[]
                            ((vector<basisu::image> *)
                             CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                             CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
      vector<basisu::image>::resize
                ((vector<basisu::image> *)
                 CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                 CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                 SUB41((uint)in_stack_fffffffffffff934 >> 0x18,0));
      uVar5 = vector<basisu::vector<basisu::image>_>::size
                        ((vector<basisu::vector<basisu::image>_> *)(in_RDI + 0x38));
      if (uVar5 == 0) {
        bVar4 = bool_param::operator_cast_to_bool(in_RDI + 0xcc);
        if ((!bVar4) ||
           (bVar4 = generate_mipmaps(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
                                     (vector<basisu::image> *)
                                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                                     SUB41((uint)in_stack_fffffffffffff9a4 >> 0x18,0)), bVar4))
        goto LAB_004b976f;
        local_11 = 0;
        local_84 = 1;
      }
      else {
        local_18c = 0;
        while( true ) {
          uVar22 = local_18c;
          pvVar13 = vector<basisu::vector<basisu::image>_>::operator[]
                              ((vector<basisu::vector<basisu::image>_> *)
                               CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          uVar5 = vector<basisu::image>::size(pvVar13);
          if (uVar5 <= uVar22) break;
          vector<basisu::vector<basisu::image>_>::operator[]
                    ((vector<basisu::vector<basisu::image>_> *)
                     CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          local_198 = vector<basisu::image>::operator[]
                                ((vector<basisu::image> *)
                                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                                 CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          if ((((in_RDI[0xc4] != (bool_param)0x0) || (in_RDI[0xc5] != (bool_param)0x1)) ||
              (in_RDI[0xc6] != (bool_param)0x2)) || (in_RDI[199] != (bool_param)0x3)) {
            for (local_19c = 0; uVar22 = local_19c, uVar5 = image::get_height(local_198),
                uVar22 < uVar5; local_19c = local_19c + 1) {
              for (local_1a0 = 0; uVar22 = local_1a0, uVar5 = image::get_width(local_198),
                  uVar22 < uVar5; local_1a0 = local_1a0 + 1) {
                local_1a8 = image::operator()((image *)CONCAT44(in_stack_fffffffffffff944,
                                                                in_stack_fffffffffffff940),
                                              in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
                pcVar11 = image::operator()((image *)CONCAT44(in_stack_fffffffffffff944,
                                                              in_stack_fffffffffffff940),
                                            in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
                pbVar12 = color_rgba::operator[]
                                    ((color_rgba *)
                                     CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                                     in_stack_fffffffffffff92c);
                bVar1 = *pbVar12;
                pbVar12 = color_rgba::operator[]
                                    ((color_rgba *)
                                     CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                                     in_stack_fffffffffffff92c);
                bVar2 = *pbVar12;
                pbVar12 = color_rgba::operator[]
                                    ((color_rgba *)
                                     CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                                     in_stack_fffffffffffff92c);
                bVar3 = *pbVar12;
                pbVar12 = color_rgba::operator[]
                                    ((color_rgba *)
                                     CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                                     in_stack_fffffffffffff92c);
                color_rgba::set_noclamp_rgba
                          (pcVar11,(uint)bVar1,(uint)bVar2,(uint)bVar3,(uint)*pbVar12);
              }
            }
          }
          vector<basisu::image>::push_back
                    ((vector<basisu::image> *)
                     CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                     (image *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
          local_18c = local_18c + 1;
        }
LAB_004b976f:
        vector<basisu::image>::operator[]
                  ((vector<basisu::image> *)
                   CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                   CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        image::swap((image *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                    (image *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        vector<basisu::image>::size(&local_180);
        vector<unsigned_int>::vector
                  ((vector<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                   CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        for (local_1bc = 0; uVar22 = local_1bc, uVar5 = vector<basisu::image>::size(&local_180),
            uVar9 = local_1bc, uVar22 < uVar5; local_1bc = local_1bc + 1) {
          puVar14 = vector<unsigned_int>::operator[]
                              ((vector<unsigned_int> *)
                               CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          *puVar14 = uVar9;
        }
        if ((((byte)in_RDI[0x748] & 1) != 0) &&
           (bVar4 = bool_param::operator_cast_to_bool(in_RDI), !bVar4)) {
          vector<basisu::image>::vector(&local_1d0);
          vector<unsigned_int>::vector(&local_1e0);
          vector<basisu::image>::size(&local_180);
          vector<basisu::image>::reserve
                    ((vector<basisu::image> *)
                     CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                     in_stack_fffffffffffff958);
          for (local_1e4 = 0; uVar22 = local_1e4, uVar5 = vector<basisu::image>::size(&local_180),
              uVar22 < uVar5; local_1e4 = local_1e4 + 1) {
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)
                       CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
            image::image(in_stack_fffffffffffff950,
                         (image *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
            image::image(in_stack_fffffffffffff950,
                         (image *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
            for (local_22c = 0; uVar22 = local_22c, uVar5 = image::get_height(local_228),
                uVar22 < uVar5; local_22c = local_22c + 1) {
              for (local_230 = 0; uVar22 = local_230, uVar5 = image::get_width(local_228),
                  uVar22 < uVar5; local_230 = local_230 + 1) {
                pcVar11 = image::operator()((image *)CONCAT44(in_stack_fffffffffffff944,
                                                              in_stack_fffffffffffff940),
                                            in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
                local_231 = (pcVar11->field_0).m_comps[3];
                pcVar11 = image::operator()((image *)CONCAT44(in_stack_fffffffffffff944,
                                                              in_stack_fffffffffffff940),
                                            in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
                color_rgba::set_noclamp_rgba
                          (pcVar11,(uint)local_231,(uint)local_231,(uint)local_231,0xff);
              }
            }
            image::set_alpha((image *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                             (uint8_t)(in_stack_fffffffffffff93c >> 0x18));
            vector<basisu::image>::push_back
                      ((vector<basisu::image> *)
                       CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                       (image *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
            vector<unsigned_int>::push_back
                      ((vector<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                       (uint *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
            vector<basisu::image>::push_back
                      ((vector<basisu::image> *)
                       CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                       (image *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
            vector<unsigned_int>::push_back
                      ((vector<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                       (uint *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
            image::~image((image *)0x4b9bbb);
            image::~image((image *)0x4b9bc8);
          }
          vector<basisu::image>::swap
                    ((vector<basisu::image> *)
                     CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     (vector<basisu::image> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          vector<unsigned_int>::swap
                    ((vector<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     (vector<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          vector<unsigned_int>::~vector
                    ((vector<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
          vector<basisu::image>::~vector
                    ((vector<basisu::image> *)
                     CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
        }
        uVar5 = vector<basisu::image>::size(&local_180);
        uVar6 = vector<unsigned_int>::size(&local_1b8);
        if (uVar5 != uVar6) {
          __assert_fail("slices.size() == mip_indices.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                        ,0x2ec,"bool basisu::basis_compressor::read_source_images()");
        }
        for (local_238 = 0; uVar22 = local_238, uVar5 = vector<basisu::image>::size(&local_180),
            uVar22 < uVar5; local_238 = local_238 + 1) {
          local_240 = vector<basisu::image>::operator[]
                                ((vector<basisu::image> *)
                                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                                 CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          local_244 = image::get_width(local_240);
          local_248 = image::get_height(local_240);
          local_249 = false;
          if (((byte)in_RDI[0x748] & 1) != 0) {
            bVar4 = bool_param::operator_cast_to_bool(in_RDI);
            if (bVar4) {
              local_249 = image::has_alpha((image *)CONCAT44(in_stack_fffffffffffff93c,
                                                             in_stack_fffffffffffff938));
            }
            else {
              local_249 = (local_238 & 1) != 0;
            }
          }
          image::get_block_width(local_240,4);
          image::get_block_height(local_240,4);
          image::crop_dup_borders
                    ((image *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                     (uint32_t)(in_stack_fffffffffffff958 >> 0x20),
                     (uint32_t)in_stack_fffffffffffff958);
          bVar4 = bool_param::operator_cast_to_bool(in_RDI + 0x70);
          if (bVar4) {
            string_format_abi_cxx11_
                      ((char *)local_270,"basis_debug_source_image_%u_slice_%u.png",(ulong)local_164
                      );
            pcVar15 = (char *)std::__cxx11::string::c_str();
            save_png(pcVar15,local_240,0,0);
            std::__cxx11::string::~string(local_270);
          }
          vector<basisu::image>::size((vector<basisu::image> *)(in_RDI + 0x250));
          enlarge_vector<basisu::vector<basisu::image_stats>>
                    ((vector<basisu::image_stats> *)
                     CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          enlarge_vector<basisu::vector<basisu::image>>
                    ((vector<basisu::image> *)
                     CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          enlarge_vector<basisu::vector<basisu::basisu_backend_slice_desc>>
                    ((vector<basisu::basisu_backend_slice_desc> *)
                     CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          pcVar15 = (char *)std::__cxx11::string::c_str();
          piVar16 = vector<basisu::image_stats>::operator[]
                              ((vector<basisu::image_stats> *)
                               CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          std::__cxx11::string::operator=((string *)piVar16,pcVar15);
          uVar6 = local_244;
          piVar16 = vector<basisu::image_stats>::operator[]
                              ((vector<basisu::image_stats> *)
                               CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          uVar5 = local_248;
          piVar16->m_width = uVar6;
          piVar16 = vector<basisu::image_stats>::operator[]
                              ((vector<basisu::image_stats> *)
                               CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          piVar16->m_height = uVar5;
          uVar6 = vector<basisu::basisu_backend_slice_desc>::size
                            ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280));
          puVar14 = vector<unsigned_int>::operator[]
                              ((vector<unsigned_int> *)
                               CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          uVar22 = *puVar14;
          uVar9 = (uint)local_249;
          uVar17 = std::__cxx11::string::c_str();
          uVar5 = local_244;
          in_stack_fffffffffffff928 = local_248;
          in_stack_fffffffffffff930 = image::get_width(local_240);
          in_stack_fffffffffffff938 = image::get_height(local_240);
          debug_printf("****** Slice %u: mip %u, alpha_slice: %u, filename: \"%s\", original: %ux%u actual: %ux%u\n"
                       ,(ulong)(uVar6 - 1),(ulong)uVar22,(ulong)(uVar9 & 1),uVar17,(ulong)uVar5);
          pbVar18 = vector<basisu::basisu_backend_slice_desc>::operator[]
                              ((vector<basisu::basisu_backend_slice_desc> *)
                               CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          pbVar18->m_first_block_index = *(uint32_t *)(in_RDI + 0x290);
          pbVar18->m_orig_width = local_244;
          pbVar18->m_orig_height = local_248;
          uVar5 = image::get_width(local_240);
          pbVar18->m_width = uVar5;
          uVar5 = image::get_height(local_240);
          pbVar18->m_height = uVar5;
          uVar5 = image::get_block_width(local_240,4);
          pbVar18->m_num_blocks_x = uVar5;
          uVar5 = image::get_block_height(local_240,4);
          pbVar18->m_num_blocks_y = uVar5;
          pbVar18->m_num_macroblocks_x = pbVar18->m_num_blocks_x + 1 >> 1;
          pbVar18->m_num_macroblocks_y = pbVar18->m_num_blocks_y + 1 >> 1;
          pbVar18->m_source_file_index = local_164;
          in_stack_fffffffffffff9b8 =
               (basis_compressor *)
               vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)
                          CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                          CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          pbVar18->m_mip_index = *(uint32_t *)&in_stack_fffffffffffff9b8->m_params;
          pbVar18->m_alpha = (bool)(local_249 & 1);
          pbVar18->m_iframe = false;
          if (*(int *)(in_RDI + 0x134) == 3) {
            pbVar18->m_iframe = local_164 == 0;
          }
          *(uint32_t *)(in_RDI + 0x290) =
               *(int *)(in_RDI + 0x290) + pbVar18->m_num_blocks_x * pbVar18->m_num_blocks_y;
          local_28 = local_28 + pbVar18->m_num_macroblocks_x * pbVar18->m_num_macroblocks_y;
          in_stack_fffffffffffff9b0 =
               vector<basisu::image>::operator[]
                         ((vector<basisu::image> *)
                          CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                          CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          image::swap((image *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                      (image *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        }
        vector<unsigned_int>::~vector
                  ((vector<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
        local_84 = 0;
      }
      vector<basisu::image>::~vector
                ((vector<basisu::image> *)
                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
      if (local_84 != 0) goto LAB_004ba9f7;
    }
    debug_printf("Total blocks: %u, Total macroblocks: %u\n",(ulong)*(uint *)(in_RDI + 0x290),
                 (ulong)local_28);
    uVar5 = vector<basisu::basisu_backend_slice_desc>::size
                      ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280));
    if (uVar5 < 0x1000000) {
      local_284 = 1;
      while (uVar22 = local_284,
            uVar5 = vector<basisu::basisu_backend_slice_desc>::size
                              ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280)),
            uVar22 < uVar5) {
        pbVar18 = vector<basisu::basisu_backend_slice_desc>::operator[]
                            ((vector<basisu::basisu_backend_slice_desc> *)
                             CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                             CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        pbVar19 = vector<basisu::basisu_backend_slice_desc>::operator[]
                            ((vector<basisu::basisu_backend_slice_desc> *)
                             CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                             CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        if (1 < (int)(pbVar19->m_source_file_index - pbVar18->m_source_file_index)) {
          local_11 = 0;
          local_84 = 1;
          goto LAB_004ba9f7;
        }
        if ((pbVar19->m_source_file_index == pbVar18->m_source_file_index) &&
           (1 < (int)(pbVar19->m_mip_index - pbVar18->m_mip_index))) {
          local_11 = 0;
          local_84 = 1;
          goto LAB_004ba9f7;
        }
        local_284 = local_284 + 1;
      }
      bVar4 = bool_param::operator_cast_to_bool(in_RDI + 0x6a);
      if (bVar4) {
        uVar5 = vector<basisu::basisu_backend_slice_desc>::size
                          ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280));
        printf("Total basis file slices: %u\n",(ulong)uVar5);
      }
      local_2a4 = 0;
      while (uVar22 = local_2a4,
            uVar5 = vector<basisu::basisu_backend_slice_desc>::size
                              ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280)),
            uVar22 < uVar5) {
        pbVar18 = vector<basisu::basisu_backend_slice_desc>::operator[]
                            ((vector<basisu::basisu_backend_slice_desc> *)
                             CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                             CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        bVar4 = bool_param::operator_cast_to_bool(in_RDI + 0x6a);
        if (bVar4) {
          in_stack_fffffffffffff930 = pbVar18->m_first_block_index;
          in_stack_fffffffffffff928 = pbVar18->m_height;
          printf("Slice: %u, alpha: %u, orig width/height: %ux%u, width/height: %ux%u, first_block: %u, image_index: %u, mip_level: %u, iframe: %u\n"
                 ,(ulong)local_2a4,(ulong)(pbVar18->m_alpha & 1),(ulong)pbVar18->m_orig_width,
                 (ulong)pbVar18->m_orig_height,(ulong)pbVar18->m_width,in_stack_fffffffffffff928,
                 in_stack_fffffffffffff930,pbVar18->m_source_file_index,pbVar18->m_mip_index,
                 pbVar18->m_iframe & 1);
        }
        if (((byte)in_RDI[0x748] & 1) == 0) {
          if ((pbVar18->m_alpha & 1U) != 0) {
            local_11 = 0;
            local_84 = 1;
            goto LAB_004ba9f7;
          }
        }
        else {
          bVar4 = bool_param::operator_cast_to_bool(in_RDI);
          if (!bVar4) {
            if ((pbVar18->m_alpha & 1U) == 0) {
              if ((local_2a4 & 1) != 0) {
                local_11 = 0;
                local_84 = 1;
                goto LAB_004ba9f7;
              }
            }
            else {
              if ((local_2a4 & 1) == 0) {
                local_11 = 0;
                local_84 = 1;
                goto LAB_004ba9f7;
              }
              pbVar19 = vector<basisu::basisu_backend_slice_desc>::operator[]
                                  ((vector<basisu::basisu_backend_slice_desc> *)
                                   CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                                   CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
              if (pbVar19->m_source_file_index != pbVar18->m_source_file_index) {
                local_11 = 0;
                local_84 = 1;
                goto LAB_004ba9f7;
              }
              if ((pbVar19->m_alpha & 1U) != 0) {
                local_11 = 0;
                local_84 = 1;
                goto LAB_004ba9f7;
              }
              if (pbVar19->m_mip_index != pbVar18->m_mip_index) {
                local_11 = 0;
                local_84 = 1;
                goto LAB_004ba9f7;
              }
              if (pbVar19->m_num_blocks_x != pbVar18->m_num_blocks_x) {
                local_11 = 0;
                local_84 = 1;
                goto LAB_004ba9f7;
              }
              if (pbVar19->m_num_blocks_y != pbVar18->m_num_blocks_y) {
                local_11 = 0;
                local_84 = 1;
                goto LAB_004ba9f7;
              }
            }
          }
        }
        if ((pbVar18->m_width < pbVar18->m_orig_width) ||
           (pbVar18->m_height < pbVar18->m_orig_height)) {
          local_11 = 0;
          local_84 = 1;
          goto LAB_004ba9f7;
        }
        if (((pbVar18->m_source_file_index == 0) && (*(int *)(in_RDI + 0x134) == 3)) &&
           ((pbVar18->m_iframe & 1U) == 0)) {
          local_11 = 0;
          local_84 = 1;
          goto LAB_004ba9f7;
        }
        local_2a4 = local_2a4 + 1;
      }
      local_11 = 1;
      local_84 = 1;
    }
    else {
      error_printf("Too many slices!\n");
      local_11 = 0;
      local_84 = 1;
    }
  }
  else {
    uVar6 = vector<basisu::image>::size((vector<basisu::image> *)(in_RDI + 0x28));
    uVar8 = vector<basisu::vector<basisu::image>_>::size
                      ((vector<basisu::vector<basisu::image>_> *)(in_RDI + 0x38));
    uVar5 = local_24;
    if ((uVar6 == uVar8) &&
       (uVar6 = vector<basisu::image>::size((vector<basisu::image> *)(in_RDI + 0x28)),
       uVar5 == uVar6)) {
      if (((byte)in_RDI[0x748] & 1) == 0) {
        for (local_150 = 0; local_150 < local_24; local_150 = local_150 + 1) {
          local_154 = 0;
          while( true ) {
            uVar22 = local_154;
            pvVar13 = vector<basisu::vector<basisu::image>_>::operator[]
                                ((vector<basisu::vector<basisu::image>_> *)
                                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                                 CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
            uVar5 = vector<basisu::image>::size(pvVar13);
            if (uVar5 <= uVar22) break;
            vector<basisu::vector<basisu::image>_>::operator[]
                      ((vector<basisu::vector<basisu::image>_> *)
                       CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
            local_160 = vector<basisu::image>::operator[]
                                  ((vector<basisu::image> *)
                                   CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                                   CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
            bVar4 = image::has_alpha((image *)CONCAT44(in_stack_fffffffffffff93c,
                                                       in_stack_fffffffffffff938));
            if (bVar4) {
              in_RDI[0x748] = (bool_param)0x1;
              break;
            }
            local_154 = local_154 + 1;
          }
          if (((byte)in_RDI[0x748] & 1) != 0) break;
        }
      }
      goto LAB_004b9276;
    }
    error_printf(
                "basis_compressor::read_source_images(): m_params.m_source_mipmap_images.size() must equal m_params.m_source_images.size()!\n"
                );
    local_11 = 0;
    local_84 = 1;
  }
LAB_004ba9f7:
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~vector
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
  vector<basisu::image>::~vector
            ((vector<basisu::image> *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930))
  ;
LAB_004baa2f:
  return (bool)(local_11 & 1);
}

Assistant:

bool basis_compressor::read_source_images()
	{
		debug_printf("basis_compressor::read_source_images\n");

		const uint32_t total_source_files = m_params.m_read_source_images ? (uint32_t)m_params.m_source_filenames.size() : (uint32_t)m_params.m_source_images.size();
		if (!total_source_files)
			return false;

		m_stats.resize(0);
		m_slice_descs.resize(0);
		m_slice_images.resize(0);

		m_total_blocks = 0;
		uint32_t total_macroblocks = 0;

		m_any_source_image_has_alpha = false;

		basisu::vector<image> source_images;
		basisu::vector<std::string> source_filenames;
		
		// First load all source images, and determine if any have an alpha channel.
		for (uint32_t source_file_index = 0; source_file_index < total_source_files; source_file_index++)
		{
			const char *pSource_filename = "";

			image file_image;
			
			if (m_params.m_read_source_images)
			{
				pSource_filename = m_params.m_source_filenames[source_file_index].c_str();

				// Load the source image
				if (!load_image(pSource_filename, file_image))
				{
					error_printf("Failed reading source image: %s\n", pSource_filename);
					return false;
				}

				if (m_params.m_status_output)
				{
					printf("Read source image \"%s\", %ux%u\n", pSource_filename, file_image.get_width(), file_image.get_height());
				}

				// Optionally load another image and put a grayscale version of it into the alpha channel.
				if ((source_file_index < m_params.m_source_alpha_filenames.size()) && (m_params.m_source_alpha_filenames[source_file_index].size()))
				{
					const char *pSource_alpha_image = m_params.m_source_alpha_filenames[source_file_index].c_str();

					image alpha_data;

					if (!load_image(pSource_alpha_image, alpha_data))
					{
						error_printf("Failed reading source image: %s\n", pSource_alpha_image);
						return false;
					}

					printf("Read source alpha image \"%s\", %ux%u\n", pSource_alpha_image, alpha_data.get_width(), alpha_data.get_height());

					alpha_data.crop(file_image.get_width(), file_image.get_height());

					for (uint32_t y = 0; y < file_image.get_height(); y++)
						for (uint32_t x = 0; x < file_image.get_width(); x++)
							file_image(x, y).a = (uint8_t)alpha_data(x, y).get_709_luma();
				}
			}
			else
			{
				file_image = m_params.m_source_images[source_file_index];
			}

			if (m_params.m_renormalize)
				file_image.renormalize_normal_map();

			bool alpha_swizzled = false;
			if (m_params.m_swizzle[0] != 0 ||
				m_params.m_swizzle[1] != 1 ||
				m_params.m_swizzle[2] != 2 ||
				m_params.m_swizzle[3] != 3)
			{
				// Used for XY normal maps in RG - puts X in color, Y in alpha
				for (uint32_t y = 0; y < file_image.get_height(); y++)
					for (uint32_t x = 0; x < file_image.get_width(); x++)
					{
						const color_rgba &c = file_image(x, y);
						file_image(x, y).set_noclamp_rgba(c[m_params.m_swizzle[0]], c[m_params.m_swizzle[1]], c[m_params.m_swizzle[2]], c[m_params.m_swizzle[3]]);
					}
				alpha_swizzled = m_params.m_swizzle[3] != 3;
			}
						
			bool has_alpha = false;
			if (m_params.m_force_alpha || alpha_swizzled)
				has_alpha = true;
			else if (!m_params.m_check_for_alpha)
				file_image.set_alpha(255);
			else if (file_image.has_alpha())
				has_alpha = true;

			if (has_alpha)
				m_any_source_image_has_alpha = true;

			debug_printf("Source image index %u filename %s %ux%u has alpha: %u\n", source_file_index, pSource_filename, file_image.get_width(), file_image.get_height(), has_alpha);
												
			if (m_params.m_y_flip)
				file_image.flip_y();

#if DEBUG_EXTRACT_SINGLE_BLOCK
			image block_image(4, 4);
			const uint32_t block_x = 0;
			const uint32_t block_y = 0;
			block_image.blit(block_x * 4, block_y * 4, 4, 4, 0, 0, file_image, 0);
			file_image = block_image;
#endif

#if DEBUG_CROP_TEXTURE_TO_64x64
			file_image.resize(64, 64);
#endif

			if (m_params.m_resample_width > 0 && m_params.m_resample_height > 0)
			{
				int new_width = basisu::minimum<int>(m_params.m_resample_width, BASISU_MAX_SUPPORTED_TEXTURE_DIMENSION);
				int new_height = basisu::minimum<int>(m_params.m_resample_height, BASISU_MAX_SUPPORTED_TEXTURE_DIMENSION);

				debug_printf("Resampling to %ix%i\n", new_width, new_height);

				// TODO: A box filter - kaiser looks too sharp on video. Let the caller control this.
				image temp_img(new_width, new_height);
				image_resample(file_image, temp_img, m_params.m_perceptual, "box"); // "kaiser");
				temp_img.swap(file_image);
			}
			else if (m_params.m_resample_factor > 0.0f)
			{
				int new_width = basisu::minimum<int>(basisu::maximum(1, (int)ceilf(file_image.get_width() * m_params.m_resample_factor)), BASISU_MAX_SUPPORTED_TEXTURE_DIMENSION);
				int new_height = basisu::minimum<int>(basisu::maximum(1, (int)ceilf(file_image.get_height() * m_params.m_resample_factor)), BASISU_MAX_SUPPORTED_TEXTURE_DIMENSION);

				debug_printf("Resampling to %ix%i\n", new_width, new_height);

				// TODO: A box filter - kaiser looks too sharp on video. Let the caller control this.
				image temp_img(new_width, new_height);
				image_resample(file_image, temp_img, m_params.m_perceptual, "box"); // "kaiser");
				temp_img.swap(file_image);
			}

			if ((!file_image.get_width()) || (!file_image.get_height()))
			{
				error_printf("basis_compressor::read_source_images: Source image has a zero width and/or height!\n");
				return false;
			}

			if ((file_image.get_width() > BASISU_MAX_SUPPORTED_TEXTURE_DIMENSION) || (file_image.get_height() > BASISU_MAX_SUPPORTED_TEXTURE_DIMENSION))
			{
				error_printf("basis_compressor::read_source_images: Source image \"%s\" is too large!\n", pSource_filename);
				return false;
			}

			source_images.enlarge(1)->swap(file_image);
			source_filenames.push_back(pSource_filename);
		}

		// Check if the caller has generated their own mipmaps. 
		if (m_params.m_source_mipmap_images.size())
		{
			// Make sure they've passed us enough mipmap chains.
			if ((m_params.m_source_images.size() != m_params.m_source_mipmap_images.size()) || (total_source_files != m_params.m_source_images.size()))
			{
				error_printf("basis_compressor::read_source_images(): m_params.m_source_mipmap_images.size() must equal m_params.m_source_images.size()!\n");
				return false;
			}

			// Check if any of the user-supplied mipmap levels has alpha.
			// We're assuming the user has already preswizzled their mipmap source images.
			if (!m_any_source_image_has_alpha)
			{
				for (uint32_t source_file_index = 0; source_file_index < total_source_files; source_file_index++)
				{
					for (uint32_t mip_index = 0; mip_index < m_params.m_source_mipmap_images[source_file_index].size(); mip_index++)
					{
						const image& mip_img = m_params.m_source_mipmap_images[source_file_index][mip_index];

						if (mip_img.has_alpha())
						{
							m_any_source_image_has_alpha = true;
							break;
						}
					}

					if (m_any_source_image_has_alpha)
						break;
				}
			}
		}

		debug_printf("Any source image has alpha: %u\n", m_any_source_image_has_alpha);

		for (uint32_t source_file_index = 0; source_file_index < total_source_files; source_file_index++)
		{
			const std::string &source_filename = source_filenames[source_file_index];

			// Now, for each source image, create the slices corresponding to that image.
			basisu::vector<image> slices;
			
			slices.reserve(32);
						
			// The first (largest) mipmap level.
			image& file_image = source_images[source_file_index];
						
			// Reserve a slot for mip0.
			slices.resize(1);
												
			if (m_params.m_source_mipmap_images.size())
			{
				// User-provided mipmaps for each layer or image in the texture array.
				for (uint32_t mip_index = 0; mip_index < m_params.m_source_mipmap_images[source_file_index].size(); mip_index++)
				{
					image& mip_img = m_params.m_source_mipmap_images[source_file_index][mip_index];

					if (m_params.m_swizzle[0] != 0 ||
						m_params.m_swizzle[1] != 1 ||
						m_params.m_swizzle[2] != 2 ||
						m_params.m_swizzle[3] != 3)
					{
						// Used for XY normal maps in RG - puts X in color, Y in alpha
						for (uint32_t y = 0; y < mip_img.get_height(); y++)
							for (uint32_t x = 0; x < mip_img.get_width(); x++)
							{
								const color_rgba &c = mip_img(x, y);
								mip_img(x, y).set_noclamp_rgba(c[m_params.m_swizzle[0]], c[m_params.m_swizzle[1]], c[m_params.m_swizzle[2]], c[m_params.m_swizzle[3]]);
							}
					}

					slices.push_back(mip_img);
				}
			}
			else if (m_params.m_mip_gen)
			{
				// Automatically generate mipmaps.
				if (!generate_mipmaps(file_image, slices, m_any_source_image_has_alpha))
					return false;
			}

			// Swap in the largest mipmap level here to avoid copying it, because generate_mips() will change the array.
			// NOTE: file_image is now blank.
			slices[0].swap(file_image);

			uint_vec mip_indices(slices.size());
			for (uint32_t i = 0; i < slices.size(); i++)
				mip_indices[i] = i;
						
			if ((m_any_source_image_has_alpha) && (!m_params.m_uastc))
			{
				// For ETC1S, if source has alpha, then even mips will have RGB, and odd mips will have alpha in RGB. 
				basisu::vector<image> alpha_slices;
				uint_vec new_mip_indices;

				alpha_slices.reserve(slices.size() * 2);

				for (uint32_t i = 0; i < slices.size(); i++)
				{
					image lvl_rgb(slices[i]);
					image lvl_a(lvl_rgb);

					for (uint32_t y = 0; y < lvl_a.get_height(); y++)
					{
						for (uint32_t x = 0; x < lvl_a.get_width(); x++)
						{
							uint8_t a = lvl_a(x, y).a;
							lvl_a(x, y).set_noclamp_rgba(a, a, a, 255);
						}
					}
					
					lvl_rgb.set_alpha(255);

					alpha_slices.push_back(lvl_rgb);
					new_mip_indices.push_back(i);

					alpha_slices.push_back(lvl_a);
					new_mip_indices.push_back(i);
				}

				slices.swap(alpha_slices);
				mip_indices.swap(new_mip_indices);
			}

			assert(slices.size() == mip_indices.size());
						
			for (uint32_t slice_index = 0; slice_index < slices.size(); slice_index++)
			{
				image& slice_image = slices[slice_index];
				const uint32_t orig_width = slice_image.get_width();
				const uint32_t orig_height = slice_image.get_height();

				bool is_alpha_slice = false;
				if (m_any_source_image_has_alpha)
				{
					if (m_params.m_uastc)
					{
						is_alpha_slice = slice_image.has_alpha();
					}
					else
					{
						is_alpha_slice = (slice_index & 1) != 0;
					}
				}

				// Enlarge the source image to 4x4 block boundaries, duplicating edge pixels if necessary to avoid introducing extra colors into blocks.
				slice_image.crop_dup_borders(slice_image.get_block_width(4) * 4, slice_image.get_block_height(4) * 4);

				if (m_params.m_debug_images)
				{
					save_png(string_format("basis_debug_source_image_%u_slice_%u.png", source_file_index, slice_index).c_str(), slice_image);
				}

				const uint32_t dest_image_index = m_slice_images.size();

				enlarge_vector(m_stats, 1);
				enlarge_vector(m_slice_images, 1);
				enlarge_vector(m_slice_descs, 1);
								
				m_stats[dest_image_index].m_filename = source_filename.c_str();
				m_stats[dest_image_index].m_width = orig_width;
				m_stats[dest_image_index].m_height = orig_height;
								
				debug_printf("****** Slice %u: mip %u, alpha_slice: %u, filename: \"%s\", original: %ux%u actual: %ux%u\n", m_slice_descs.size() - 1, mip_indices[slice_index], is_alpha_slice, source_filename.c_str(), orig_width, orig_height, slice_image.get_width(), slice_image.get_height());

				basisu_backend_slice_desc &slice_desc = m_slice_descs[dest_image_index];

				slice_desc.m_first_block_index = m_total_blocks;

				slice_desc.m_orig_width = orig_width;
				slice_desc.m_orig_height = orig_height;

				slice_desc.m_width = slice_image.get_width();
				slice_desc.m_height = slice_image.get_height();

				slice_desc.m_num_blocks_x = slice_image.get_block_width(4);
				slice_desc.m_num_blocks_y = slice_image.get_block_height(4);

				slice_desc.m_num_macroblocks_x = (slice_desc.m_num_blocks_x + 1) >> 1;
				slice_desc.m_num_macroblocks_y = (slice_desc.m_num_blocks_y + 1) >> 1;

				slice_desc.m_source_file_index = source_file_index;
				
				slice_desc.m_mip_index = mip_indices[slice_index];

				slice_desc.m_alpha = is_alpha_slice;
				slice_desc.m_iframe = false;
				if (m_params.m_tex_type == basist::cBASISTexTypeVideoFrames)
				{
					slice_desc.m_iframe = (source_file_index == 0);
				}

				m_total_blocks += slice_desc.m_num_blocks_x * slice_desc.m_num_blocks_y;
				total_macroblocks += slice_desc.m_num_macroblocks_x * slice_desc.m_num_macroblocks_y;

				// Finally, swap in the slice's image to avoid copying it.
				// NOTE: slice_image is now blank.
				m_slice_images[dest_image_index].swap(slice_image);
			
			} // slice_index

		} // source_file_index

		debug_printf("Total blocks: %u, Total macroblocks: %u\n", m_total_blocks, total_macroblocks);

		// Make sure we don't have too many slices
		if (m_slice_descs.size() > BASISU_MAX_SLICES)
		{
			error_printf("Too many slices!\n");
			return false;
		}
				
		// Basic sanity check on the slices
		for (uint32_t i = 1; i < m_slice_descs.size(); i++)
		{
			const basisu_backend_slice_desc &prev_slice_desc = m_slice_descs[i - 1];
			const basisu_backend_slice_desc &slice_desc = m_slice_descs[i];

			// Make sure images are in order
			int image_delta = (int)slice_desc.m_source_file_index - (int)prev_slice_desc.m_source_file_index;
			if (image_delta > 1)
				return false;	

			// Make sure mipmap levels are in order
			if (!image_delta)
			{
				int level_delta = (int)slice_desc.m_mip_index - (int)prev_slice_desc.m_mip_index;
				if (level_delta > 1)
					return false;
			}
		}

		if (m_params.m_status_output)
		{
			printf("Total basis file slices: %u\n", (uint32_t)m_slice_descs.size());
		}

		for (uint32_t i = 0; i < m_slice_descs.size(); i++)
		{
			const basisu_backend_slice_desc &slice_desc = m_slice_descs[i];

			if (m_params.m_status_output)
			{
				printf("Slice: %u, alpha: %u, orig width/height: %ux%u, width/height: %ux%u, first_block: %u, image_index: %u, mip_level: %u, iframe: %u\n",
					i, slice_desc.m_alpha, slice_desc.m_orig_width, slice_desc.m_orig_height, slice_desc.m_width, slice_desc.m_height, slice_desc.m_first_block_index, slice_desc.m_source_file_index, slice_desc.m_mip_index, slice_desc.m_iframe);
			}

			if (m_any_source_image_has_alpha)
			{
				if (!m_params.m_uastc)
				{
					// For ETC1S, alpha slices must be at odd slice indices.
					if (slice_desc.m_alpha)
					{
						if ((i & 1) == 0)
							return false;

						const basisu_backend_slice_desc& prev_slice_desc = m_slice_descs[i - 1];

						// Make sure previous slice has this image's color data
						if (prev_slice_desc.m_source_file_index != slice_desc.m_source_file_index)
							return false;
						if (prev_slice_desc.m_alpha)
							return false;
						if (prev_slice_desc.m_mip_index != slice_desc.m_mip_index)
							return false;
						if (prev_slice_desc.m_num_blocks_x != slice_desc.m_num_blocks_x)
							return false;
						if (prev_slice_desc.m_num_blocks_y != slice_desc.m_num_blocks_y)
							return false;
					}
					else if (i & 1)
						return false;
				}
			}
			else if (slice_desc.m_alpha)
			{
				return false;
			}

			if ((slice_desc.m_orig_width > slice_desc.m_width) || (slice_desc.m_orig_height > slice_desc.m_height))
				return false;
			if ((slice_desc.m_source_file_index == 0) && (m_params.m_tex_type == basist::cBASISTexTypeVideoFrames))
			{
				if (!slice_desc.m_iframe)
					return false;
			}
		}

		return true;
	}